

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddInstallNamePatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  cmMakefile *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  cmComputeLinkInformation *this_02;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  string new_id;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  install_name_remap;
  string fname;
  string for_install;
  string installNameTool;
  string local_50;
  
  if ((this->ImportLibrary == false) &&
     (((TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == SHARED_LIBRARY ||
       (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == MODULE_LIBRARY)) ||
      (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == EXECUTABLE)))) {
    this_00 = this->Target->Target->Makefile;
    std::__cxx11::string::string
              ((string *)&install_name_remap,"CMAKE_INSTALL_NAME_TOOL",(allocator *)&new_id);
    pcVar3 = cmMakefile::GetSafeDefinition(this_00,(string *)&install_name_remap);
    std::__cxx11::string::string((string *)&installNameTool,pcVar3,(allocator *)&for_install);
    std::__cxx11::string::~string((string *)&install_name_remap);
    if (installNameTool._M_string_length != 0) {
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header;
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      this_02 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
      if (this_02 != (cmComputeLinkInformation *)0x0) {
        psVar4 = cmComputeLinkInformation::GetSharedLibrariesLinked(this_02);
        for (p_Var6 = (psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          this_01 = *(cmGeneratorTarget **)(p_Var6 + 1);
          bVar1 = cmGeneratorTarget::IsImported(this_01);
          if (!bVar1) {
            cmGeneratorTarget::GetInstallNameDirForBuildTree(&new_id,this_01,config);
            cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_(&for_install,this_01);
            bVar1 = std::operator!=(&new_id,&for_install);
            if (bVar1) {
              GetInstallFilename(&fname,this_01,config,NameSO);
              std::__cxx11::string::append((string *)&new_id);
              std::__cxx11::string::append((string *)&for_install);
              pmVar5 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&install_name_remap,&new_id);
              std::__cxx11::string::_M_assign((string *)pmVar5);
              std::__cxx11::string::~string((string *)&fname);
            }
            std::__cxx11::string::~string((string *)&for_install);
            std::__cxx11::string::~string((string *)&new_id);
          }
        }
      }
      new_id._M_dataplus._M_p = (pointer)&new_id.field_2;
      new_id._M_string_length = 0;
      new_id.field_2._M_local_buf[0] = '\0';
      TVar2 = cmGeneratorTarget::GetType(this->Target);
      if (TVar2 == SHARED_LIBRARY) {
        cmGeneratorTarget::GetInstallNameDirForBuildTree(&for_install,this->Target,config);
        cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_(&fname,this->Target);
        cmGeneratorTarget::IsFrameworkOnApple(this->Target);
        bVar1 = std::operator!=(&for_install,&fname);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)&new_id);
          GetInstallFilename(&local_50,this->Target,config,NameSO);
          std::__cxx11::string::append((string *)&new_id);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::__cxx11::string::~string((string *)&fname);
        std::__cxx11::string::~string((string *)&for_install);
      }
      if (install_name_remap._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 ||
          new_id._M_string_length != 0) {
        poVar7 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
        poVar7 = std::operator<<(poVar7,"execute_process(COMMAND \"");
        std::operator<<(poVar7,(string *)&installNameTool);
        std::operator<<(os,"\"");
        p_Var8 = install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (new_id._M_string_length != 0) {
          poVar7 = std::operator<<(os,"\n");
          poVar7 = operator<<(poVar7,(cmScriptGeneratorIndent)indent.Level);
          poVar7 = std::operator<<(poVar7,"  -id \"");
          poVar7 = std::operator<<(poVar7,(string *)&new_id);
          std::operator<<(poVar7,"\"");
          p_Var8 = install_name_remap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        for (; (_Rb_tree_header *)p_Var8 != &install_name_remap._M_t._M_impl.super__Rb_tree_header;
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
          poVar7 = std::operator<<(os,"\n");
          poVar7 = operator<<(poVar7,(cmScriptGeneratorIndent)indent.Level);
          poVar7 = std::operator<<(poVar7,"  -change \"");
          poVar7 = std::operator<<(poVar7,(string *)(p_Var8 + 1));
          poVar7 = std::operator<<(poVar7,"\" \"");
          poVar7 = std::operator<<(poVar7,(string *)(p_Var8 + 2));
          std::operator<<(poVar7,"\"");
        }
        poVar7 = std::operator<<(os,"\n");
        poVar7 = operator<<(poVar7,(cmScriptGeneratorIndent)indent.Level);
        poVar7 = std::operator<<(poVar7,"  \"");
        poVar7 = std::operator<<(poVar7,(string *)toDestDirPath);
        std::operator<<(poVar7,"\")\n");
      }
      std::__cxx11::string::~string((string *)&new_id);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&install_name_remap._M_t);
    }
    std::__cxx11::string::~string((string *)&installNameTool);
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddInstallNamePatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  if (this->ImportLibrary ||
      !(this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::EXECUTABLE)) {
    return;
  }

  // Fix the install_name settings in installed binaries.
  std::string installNameTool =
    this->Target->Target->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  if (installNameTool.empty()) {
    return;
  }

  // Build a map of build-tree install_name to install-tree install_name for
  // shared libraries linked to this target.
  std::map<std::string, std::string> install_name_remap;
  if (cmComputeLinkInformation* cli =
        this->Target->GetLinkInformation(config)) {
    std::set<cmGeneratorTarget const*> const& sharedLibs =
      cli->GetSharedLibrariesLinked();
    for (std::set<cmGeneratorTarget const*>::const_iterator j =
           sharedLibs.begin();
         j != sharedLibs.end(); ++j) {
      cmGeneratorTarget const* tgt = *j;

      // The install_name of an imported target does not change.
      if (tgt->IsImported()) {
        continue;
      }

      // If the build tree and install tree use different path
      // components of the install_name field then we need to create a
      // mapping to be applied after installation.
      std::string for_build = tgt->GetInstallNameDirForBuildTree(config);
      std::string for_install = tgt->GetInstallNameDirForInstallTree();
      if (for_build != for_install) {
        // The directory portions differ.  Append the filename to
        // create the mapping.
        std::string fname = this->GetInstallFilename(tgt, config, NameSO);

        // Map from the build-tree install_name.
        for_build += fname;

        // Map to the install-tree install_name.
        for_install += fname;

        // Store the mapping entry.
        install_name_remap[for_build] = for_install;
      }
    }
  }

  // Edit the install_name of the target itself if necessary.
  std::string new_id;
  if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string for_build =
      this->Target->GetInstallNameDirForBuildTree(config);
    std::string for_install = this->Target->GetInstallNameDirForInstallTree();

    if (this->Target->IsFrameworkOnApple() && for_install.empty()) {
      // Frameworks seem to have an id corresponding to their own full
      // path.
      // ...
      // for_install = fullDestPath_without_DESTDIR_or_name;
    }

    // If the install name will change on installation set the new id
    // on the installed file.
    if (for_build != for_install) {
      // Prepare to refer to the install-tree install_name.
      new_id = for_install;
      new_id += this->GetInstallFilename(this->Target, config, NameSO);
    }
  }

  // Write a rule to run install_name_tool to set the install-tree
  // install_name value and references.
  if (!new_id.empty() || !install_name_remap.empty()) {
    os << indent << "execute_process(COMMAND \"" << installNameTool;
    os << "\"";
    if (!new_id.empty()) {
      os << "\n" << indent << "  -id \"" << new_id << "\"";
    }
    for (std::map<std::string, std::string>::const_iterator i =
           install_name_remap.begin();
         i != install_name_remap.end(); ++i) {
      os << "\n"
         << indent << "  -change \"" << i->first << "\" \"" << i->second
         << "\"";
    }
    os << "\n" << indent << "  \"" << toDestDirPath << "\")\n";
  }
}